

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O3

void CheckNumber(TidyDocImpl *doc,Node *node,AttVal *attval)

{
  char cVar1;
  TidyAttrId TVar2;
  Dict *pDVar3;
  int iVar4;
  Bool BVar5;
  TidyTagId TVar6;
  uint code;
  char *pcVar7;
  
  if ((attval == (AttVal *)0x0) || (pcVar7 = attval->value, pcVar7 == (char *)0x0)) {
    code = 0x256;
  }
  else {
    if ((node != (Node *)0x0) && (pDVar3 = node->tag, pDVar3 != (Dict *)0x0)) {
      TVar6 = pDVar3->id;
      if (TVar6 == TidyTag_FRAMESET) {
        if (attval->dict != (Attribute *)0x0) {
          TVar2 = attval->dict->id;
          if (TVar2 == TidyAttr_COLS) {
            return;
          }
          if (TVar2 == TidyAttr_ROWS) {
            return;
          }
        }
        TVar6 = pDVar3->id;
      }
      if ((TVar6 == TidyTag_FONT) && ((*pcVar7 == '-' || (*pcVar7 == '+')))) {
        pcVar7 = pcVar7 + 1;
      }
    }
    if ((attval->attribute != (char *)0x0) &&
       (iVar4 = strcmp(attval->attribute,"tabindex"), iVar4 == 0)) {
      pcVar7 = pcVar7 + (*pcVar7 == '-');
    }
    cVar1 = *pcVar7;
    while( true ) {
      if (cVar1 == '\0') {
        return;
      }
      pcVar7 = pcVar7 + 1;
      BVar5 = prvTidyIsDigit((int)cVar1);
      if (BVar5 == no) break;
      cVar1 = *pcVar7;
    }
    code = 0x22b;
  }
  prvTidyReportAttrError(doc,node,attval,code);
  return;
}

Assistant:

void CheckNumber( TidyDocImpl* doc, Node *node, AttVal *attval)
{
    tmbstr p;
    
    if (!AttrHasValue(attval))
    {
        TY_(ReportAttrError)( doc, node, attval, MISSING_ATTR_VALUE);
        return;
    }

    /* don't check <frameset cols=... rows=...> */
    if ( nodeIsFRAMESET(node) &&
        (attrIsCOLS(attval) || attrIsROWS(attval)))
     return;

    p  = attval->value;
    
    /* font size may be preceded by + or - */
    if ( nodeIsFONT(node) && (*p == '+' || *p == '-') )
        ++p;
    /* tabindex may be preceeded by - */
    if (attval->attribute && (strcmp(attval->attribute,"tabindex") == 0) && (*p == '-'))
        ++p;

    while (*p)
    {
        if (!TY_(IsDigit)(*p))
        {
            TY_(ReportAttrError)( doc, node, attval, BAD_ATTRIBUTE_VALUE);
            break;
        }
        ++p;
    }
}